

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void iprog_set(OBJ_INDEX_DATA *obj,char *progtype,char *name)

{
  bool bVar1;
  char *pcVar2;
  char *in_RDX;
  short *in_RSI;
  CLogger *in_RDI;
  __type_conflict2 _Var3;
  string_view in_stack_00000000;
  int i;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  local_1c = 0;
  while ((iprog_table[local_1c].name != (char *)0x0 &&
         (bVar1 = str_cmp(iprog_table[local_1c].name,in_RDX), bVar1))) {
    local_1c = local_1c + 1;
  }
  if (iprog_table[local_1c].name == (char *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    CLogger::Warn<short&>(in_RDI,in_stack_00000000,in_RSI);
  }
  else {
    bVar1 = str_cmp((char *)in_RSI,"wear_prog");
    if (bVar1) {
      bVar1 = str_cmp((char *)in_RSI,"remove_prog");
      if (bVar1) {
        bVar1 = str_cmp((char *)in_RSI,"get_prog");
        if (bVar1) {
          bVar1 = str_cmp((char *)in_RSI,"loot_prog");
          if (bVar1) {
            bVar1 = str_cmp((char *)in_RSI,"drop_prog");
            if (bVar1) {
              bVar1 = str_cmp((char *)in_RSI,"sac_prog");
              if (bVar1) {
                bVar1 = str_cmp((char *)in_RSI,"entry_prog");
                if (bVar1) {
                  bVar1 = str_cmp((char *)in_RSI,"give_prog");
                  if (bVar1) {
                    bVar1 = str_cmp((char *)in_RSI,"greet_prog");
                    if (bVar1) {
                      bVar1 = str_cmp((char *)in_RSI,"fight_prog");
                      if (bVar1) {
                        bVar1 = str_cmp((char *)in_RSI,"death_prog");
                        if (bVar1) {
                          bVar1 = str_cmp((char *)in_RSI,"speech_prog");
                          if (bVar1) {
                            bVar1 = str_cmp((char *)in_RSI,"pulse_prog");
                            if (bVar1) {
                              bVar1 = str_cmp((char *)in_RSI,"invoke_prog");
                              if (bVar1) {
                                bVar1 = str_cmp((char *)in_RSI,"open_prog");
                                if (bVar1) {
                                  bVar1 = str_cmp((char *)in_RSI,"look_prog");
                                  if (bVar1) {
                                    bVar1 = str_cmp((char *)in_RSI,"verb_prog");
                                    if (bVar1) {
                                      bVar1 = str_cmp((char *)in_RSI,"hit_prog");
                                      if (bVar1) {
                                        std::basic_string_view<char,_std::char_traits<char>_>::
                                        basic_string_view(in_stack_ffffffffffffffd0,
                                                          in_stack_ffffffffffffffc8);
                                        CLogger::Error<short&>(in_RDI,in_stack_00000000,in_RSI);
                                        exit(1);
                                      }
                                      *(void **)(*(long *)(in_RDI + 0xf0) + 0x88) =
                                           iprog_table[local_1c].function;
                                      free_pstring(in_stack_ffffffffffffffc0);
                                      pcVar2 = palloc_string(in_RDX);
                                      *(char **)(*(long *)(in_RDI + 0xf0) + 0x118) = pcVar2;
                                      _Var3 = std::pow<int,int>(0,0x66f39b);
                                      *(ulong *)(in_RDI + 0xf8) =
                                           (long)_Var3 | *(ulong *)(in_RDI + 0xf8);
                                    }
                                    else {
                                      *(void **)(*(long *)(in_RDI + 0xf0) + 0x80) =
                                           iprog_table[local_1c].function;
                                      if (*(long *)(*(long *)(in_RDI + 0xf0) + 0x110) != 0) {
                                        free_pstring(in_stack_ffffffffffffffc0);
                                      }
                                      pcVar2 = palloc_string(in_RDX);
                                      *(char **)(*(long *)(in_RDI + 0xf0) + 0x110) = pcVar2;
                                      _Var3 = std::pow<int,int>(0,0x66f2f4);
                                      *(ulong *)(in_RDI + 0xf8) =
                                           (long)_Var3 | *(ulong *)(in_RDI + 0xf8);
                                    }
                                  }
                                  else {
                                    *(void **)(*(long *)(in_RDI + 0xf0) + 0x78) =
                                         iprog_table[local_1c].function;
                                    if (*(long *)(*(long *)(in_RDI + 0xf0) + 0x108) != 0) {
                                      free_pstring(in_stack_ffffffffffffffc0);
                                    }
                                    pcVar2 = palloc_string(in_RDX);
                                    *(char **)(*(long *)(in_RDI + 0xf0) + 0x108) = pcVar2;
                                    _Var3 = std::pow<int,int>(0,0x66f237);
                                    *(ulong *)(in_RDI + 0xf8) =
                                         (long)_Var3 | *(ulong *)(in_RDI + 0xf8);
                                  }
                                }
                                else {
                                  *(void **)(*(long *)(in_RDI + 0xf0) + 0x70) =
                                       iprog_table[local_1c].function;
                                  if (*(long *)(*(long *)(in_RDI + 0xf0) + 0x100) != 0) {
                                    free_pstring(in_stack_ffffffffffffffc0);
                                  }
                                  pcVar2 = palloc_string(in_RDX);
                                  *(char **)(*(long *)(in_RDI + 0xf0) + 0x100) = pcVar2;
                                  _Var3 = std::pow<int,int>(0,0x66f17d);
                                  *(ulong *)(in_RDI + 0xf8) =
                                       (long)_Var3 | *(ulong *)(in_RDI + 0xf8);
                                }
                              }
                              else {
                                *(void **)(*(long *)(in_RDI + 0xf0) + 0x68) =
                                     iprog_table[local_1c].function;
                                if (*(long *)(*(long *)(in_RDI + 0xf0) + 0xf8) != 0) {
                                  free_pstring(in_stack_ffffffffffffffc0);
                                }
                                pcVar2 = palloc_string(in_RDX);
                                *(char **)(*(long *)(in_RDI + 0xf0) + 0xf8) = pcVar2;
                                _Var3 = std::pow<int,int>(0,0x66f0c3);
                                *(ulong *)(in_RDI + 0xf8) = (long)_Var3 | *(ulong *)(in_RDI + 0xf8);
                              }
                            }
                            else {
                              *(void **)(*(long *)(in_RDI + 0xf0) + 0x60) =
                                   iprog_table[local_1c].function;
                              if (*(long *)(*(long *)(in_RDI + 0xf0) + 0xf0) != 0) {
                                free_pstring(in_stack_ffffffffffffffc0);
                              }
                              pcVar2 = palloc_string(in_RDX);
                              *(char **)(*(long *)(in_RDI + 0xf0) + 0xf0) = pcVar2;
                              _Var3 = std::pow<int,int>(0,0x66f009);
                              *(ulong *)(in_RDI + 0xf8) = (long)_Var3 | *(ulong *)(in_RDI + 0xf8);
                            }
                          }
                          else {
                            *(void **)(*(long *)(in_RDI + 0xf0) + 0x58) =
                                 iprog_table[local_1c].function;
                            if (*(long *)(*(long *)(in_RDI + 0xf0) + 0xe8) != 0) {
                              free_pstring(in_stack_ffffffffffffffc0);
                            }
                            pcVar2 = palloc_string(in_RDX);
                            *(char **)(*(long *)(in_RDI + 0xf0) + 0xe8) = pcVar2;
                            _Var3 = std::pow<int,int>(0,0x66ef4f);
                            *(ulong *)(in_RDI + 0xf8) = (long)_Var3 | *(ulong *)(in_RDI + 0xf8);
                          }
                        }
                        else {
                          *(void **)(*(long *)(in_RDI + 0xf0) + 0x50) =
                               iprog_table[local_1c].function;
                          if (*(long *)(*(long *)(in_RDI + 0xf0) + 0xe0) != 0) {
                            free_pstring(in_stack_ffffffffffffffc0);
                          }
                          pcVar2 = palloc_string(in_RDX);
                          *(char **)(*(long *)(in_RDI + 0xf0) + 0xe0) = pcVar2;
                          _Var3 = std::pow<int,int>(0,0x66ee95);
                          *(ulong *)(in_RDI + 0xf8) = (long)_Var3 | *(ulong *)(in_RDI + 0xf8);
                        }
                      }
                      else {
                        *(void **)(*(long *)(in_RDI + 0xf0) + 0x48) = iprog_table[local_1c].function
                        ;
                        if (*(long *)(*(long *)(in_RDI + 0xf0) + 0xd8) != 0) {
                          free_pstring(in_stack_ffffffffffffffc0);
                        }
                        pcVar2 = palloc_string(in_RDX);
                        *(char **)(*(long *)(in_RDI + 0xf0) + 0xd8) = pcVar2;
                        _Var3 = std::pow<int,int>(0,0x66eddb);
                        *(ulong *)(in_RDI + 0xf8) = (long)_Var3 | *(ulong *)(in_RDI + 0xf8);
                      }
                    }
                    else {
                      *(void **)(*(long *)(in_RDI + 0xf0) + 0x40) = iprog_table[local_1c].function;
                      if (*(long *)(*(long *)(in_RDI + 0xf0) + 0xd0) != 0) {
                        free_pstring(in_stack_ffffffffffffffc0);
                      }
                      pcVar2 = palloc_string(in_RDX);
                      *(char **)(*(long *)(in_RDI + 0xf0) + 0xd0) = pcVar2;
                      _Var3 = std::pow<int,int>(0,0x66ed21);
                      *(ulong *)(in_RDI + 0xf8) = (long)_Var3 | *(ulong *)(in_RDI + 0xf8);
                    }
                  }
                  else {
                    *(void **)(*(long *)(in_RDI + 0xf0) + 0x38) = iprog_table[local_1c].function;
                    if (*(long *)(*(long *)(in_RDI + 0xf0) + 200) != 0) {
                      free_pstring(in_stack_ffffffffffffffc0);
                    }
                    pcVar2 = palloc_string(in_RDX);
                    *(char **)(*(long *)(in_RDI + 0xf0) + 200) = pcVar2;
                    _Var3 = std::pow<int,int>(0,0x66ec67);
                    *(ulong *)(in_RDI + 0xf8) = (long)_Var3 | *(ulong *)(in_RDI + 0xf8);
                  }
                }
                else {
                  *(void **)(*(long *)(in_RDI + 0xf0) + 0x30) = iprog_table[local_1c].function;
                  if (*(long *)(*(long *)(in_RDI + 0xf0) + 0xc0) != 0) {
                    free_pstring(in_stack_ffffffffffffffc0);
                  }
                  pcVar2 = palloc_string(in_RDX);
                  *(char **)(*(long *)(in_RDI + 0xf0) + 0xc0) = pcVar2;
                  _Var3 = std::pow<int,int>(0,0x66ebad);
                  *(ulong *)(in_RDI + 0xf8) = (long)_Var3 | *(ulong *)(in_RDI + 0xf8);
                }
              }
              else {
                *(void **)(*(long *)(in_RDI + 0xf0) + 0x28) = iprog_table[local_1c].function;
                free_pstring(in_stack_ffffffffffffffc0);
                pcVar2 = palloc_string(in_RDX);
                *(char **)(*(long *)(in_RDI + 0xf0) + 0xb8) = pcVar2;
                _Var3 = std::pow<int,int>(0,0x66eaf3);
                *(ulong *)(in_RDI + 0xf8) = (long)_Var3 | *(ulong *)(in_RDI + 0xf8);
              }
            }
            else {
              *(void **)(*(long *)(in_RDI + 0xf0) + 0x20) = iprog_table[local_1c].function;
              if (*(long *)(*(long *)(in_RDI + 0xf0) + 0xb0) != 0) {
                free_pstring(in_stack_ffffffffffffffc0);
              }
              pcVar2 = palloc_string(in_RDX);
              *(char **)(*(long *)(in_RDI + 0xf0) + 0xb0) = pcVar2;
              _Var3 = std::pow<int,int>(0,0x66ea4f);
              *(ulong *)(in_RDI + 0xf8) = (long)_Var3 | *(ulong *)(in_RDI + 0xf8);
            }
          }
          else {
            *(void **)(*(long *)(in_RDI + 0xf0) + 0x18) = iprog_table[local_1c].function;
            if (*(long *)(*(long *)(in_RDI + 0xf0) + 0xa8) != 0) {
              free_pstring(in_stack_ffffffffffffffc0);
            }
            pcVar2 = palloc_string(in_RDX);
            *(char **)(*(long *)(in_RDI + 0xf0) + 0xa8) = pcVar2;
            _Var3 = std::pow<int,int>(0,0x66e998);
            *(ulong *)(in_RDI + 0xf8) = (long)_Var3 | *(ulong *)(in_RDI + 0xf8);
          }
        }
        else {
          *(void **)(*(long *)(in_RDI + 0xf0) + 0x10) = iprog_table[local_1c].function;
          if (*(long *)(*(long *)(in_RDI + 0xf0) + 0xa0) != 0) {
            free_pstring(in_stack_ffffffffffffffc0);
          }
          pcVar2 = palloc_string(in_RDX);
          *(char **)(*(long *)(in_RDI + 0xf0) + 0xa0) = pcVar2;
          _Var3 = std::pow<int,int>(0,0x66e8de);
          *(ulong *)(in_RDI + 0xf8) = (long)_Var3 | *(ulong *)(in_RDI + 0xf8);
        }
      }
      else {
        *(void **)(*(long *)(in_RDI + 0xf0) + 8) = iprog_table[local_1c].function;
        if (*(long *)(*(long *)(in_RDI + 0xf0) + 0x98) != 0) {
          free_pstring(in_stack_ffffffffffffffc0);
        }
        pcVar2 = palloc_string(in_RDX);
        *(char **)(*(long *)(in_RDI + 0xf0) + 0x98) = pcVar2;
        _Var3 = std::pow<int,int>(0,0x66e824);
        *(ulong *)(in_RDI + 0xf8) = (long)_Var3 | *(ulong *)(in_RDI + 0xf8);
      }
    }
    else {
      **(undefined8 **)(in_RDI + 0xf0) = iprog_table[local_1c].function;
      if (*(long *)(*(long *)(in_RDI + 0xf0) + 0x90) != 0) {
        free_pstring(in_stack_ffffffffffffffc0);
      }
      pcVar2 = palloc_string(in_RDX);
      *(char **)(*(long *)(in_RDI + 0xf0) + 0x90) = pcVar2;
      _Var3 = std::pow<int,int>(0,0x66e76a);
      *(ulong *)(in_RDI + 0xf8) = (long)_Var3 | *(ulong *)(in_RDI + 0xf8);
    }
  }
  return;
}

Assistant:

void iprog_set(OBJ_INDEX_DATA *obj, const char *progtype, const char *name)
{
	int i;
	for (i = 0; iprog_table[i].name != nullptr; i++)
	{
		if (!str_cmp(iprog_table[i].name, name))
			break;
	}

	if (!iprog_table[i].name)
	{
		RS.Logger.Warn("Load_improgs: 'I': Function not found for vnum {}", obj->vnum);
		return;
	}

	if (!str_cmp(progtype, "wear_prog"))
	{
		obj->iprogs->wear_prog = (IPROG_FUN_WEAR *)iprog_table[i].function;

		if (obj->iprogs->wear_name)
			free_pstring(obj->iprogs->wear_name);

		obj->iprogs->wear_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_WEAR);
		return;
	}

	if (!str_cmp(progtype, "remove_prog"))
	{
		obj->iprogs->remove_prog = (IPROG_FUN_REMOVE *)iprog_table[i].function;

		if (obj->iprogs->remove_name)
			free_pstring(obj->iprogs->remove_name);

		obj->iprogs->remove_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_REMOVE);
		return;
	}

	if (!str_cmp(progtype, "get_prog"))
	{
		obj->iprogs->get_prog = (IPROG_FUN_GET *)iprog_table[i].function;

		if (obj->iprogs->get_name)
			free_pstring(obj->iprogs->get_name);

		obj->iprogs->get_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_GET);
		return;
	}

	if (!str_cmp(progtype, "loot_prog")) /* Returning false prevents taking */
	{
		obj->iprogs->loot_prog = (IPROG_FUN_LOOT *)iprog_table[i].function;

		if (obj->iprogs->loot_name)
			free_pstring(obj->iprogs->loot_name);

		obj->iprogs->loot_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_LOOT);
		return;
	}

	if (!str_cmp(progtype, "drop_prog"))
	{
		obj->iprogs->drop_prog = (IPROG_FUN_DROP *)iprog_table[i].function;

		if (obj->iprogs->drop_name)
			free_pstring(obj->iprogs->drop_name);

		obj->iprogs->drop_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_DROP);
		return;
	}

	if (!str_cmp(progtype, "sac_prog"))
	{
		obj->iprogs->sac_prog = (IPROG_FUN_SAC *)iprog_table[i].function;
		free_pstring(obj->iprogs->sac_name);

		obj->iprogs->sac_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_SAC);
		return;
	}

	if (!str_cmp(progtype, "entry_prog"))
	{
		obj->iprogs->entry_prog = (IPROG_FUN_ENTRY *)iprog_table[i].function;

		if (obj->iprogs->entry_name)
			free_pstring(obj->iprogs->entry_name);

		obj->iprogs->entry_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_ENTRY);
		return;
	}

	if (!str_cmp(progtype, "give_prog"))
	{
		obj->iprogs->give_prog = (IPROG_FUN_GIVE *)iprog_table[i].function;

		if (obj->iprogs->give_name)
			free_pstring(obj->iprogs->give_name);

		obj->iprogs->give_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_GIVE);
		return;
	}

	if (!str_cmp(progtype, "greet_prog"))
	{
		obj->iprogs->greet_prog = (IPROG_FUN_GREET *)iprog_table[i].function;

		if (obj->iprogs->greet_name)
			free_pstring(obj->iprogs->greet_name);

		obj->iprogs->greet_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_GREET);
		return;
	}

	if (!str_cmp(progtype, "fight_prog"))
	{
		obj->iprogs->fight_prog = (IPROG_FUN_FIGHT *)iprog_table[i].function;

		if (obj->iprogs->fight_name)
			free_pstring(obj->iprogs->fight_name);

		obj->iprogs->fight_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_FIGHT);
		return;
	}

	if (!str_cmp(progtype, "death_prog")) /* returning true prevents death */
	{
		obj->iprogs->death_prog = (IPROG_FUN_DEATH *)iprog_table[i].function;

		if (obj->iprogs->death_name)
			free_pstring(obj->iprogs->death_name);

		obj->iprogs->death_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_DEATH);
		return;
	}

	if (!str_cmp(progtype, "speech_prog"))
	{
		obj->iprogs->speech_prog = (IPROG_FUN_SPEECH *)iprog_table[i].function;

		if (obj->iprogs->speech_name)
			free_pstring(obj->iprogs->speech_name);

		obj->iprogs->speech_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_SPEECH);
		return;
	}

	if (!str_cmp(progtype, "pulse_prog"))
	{
		obj->iprogs->pulse_prog = (IPROG_FUN_PULSE *)iprog_table[i].function;

		if (obj->iprogs->pulse_name)
			free_pstring(obj->iprogs->pulse_name);

		obj->iprogs->pulse_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_PULSE);
		return;
	}

	if (!str_cmp(progtype, "invoke_prog"))
	{
		obj->iprogs->invoke_prog = (IPROG_FUN_INVOKE *)iprog_table[i].function;
		if (obj->iprogs->invoke_name)
			free_pstring(obj->iprogs->invoke_name);
		obj->iprogs->invoke_name = palloc_string(name);
		SET_BIT(obj->progtypes, IPROG_INVOKE);
		return;
	}

	if (!str_cmp(progtype, "open_prog"))
	{
		obj->iprogs->open_prog = (IPROG_FUN_OPEN *)iprog_table[i].function;

		if (obj->iprogs->open_name)
			free_pstring(obj->iprogs->open_name);

		obj->iprogs->open_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_OPEN);
		return;
	}

	if (!str_cmp(progtype, "look_prog"))
	{
		obj->iprogs->look_prog = (IPROG_FUN_LOOK *)iprog_table[i].function;

		if (obj->iprogs->look_name)
			free_pstring(obj->iprogs->look_name);

		obj->iprogs->look_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_OPEN);
		return;
	}

	if (!str_cmp(progtype, "verb_prog"))
	{
		obj->iprogs->verb_prog = (IPROG_FUN_VERB *)iprog_table[i].function;

		if (obj->iprogs->verb_name)
			free_pstring(obj->iprogs->verb_name);

		obj->iprogs->verb_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_VERB);
		return;
	}

	if (!str_cmp(progtype, "hit_prog"))
	{
		obj->iprogs->hit_prog = (IPROG_FUN_HIT *)iprog_table[i].function;
		free_pstring(obj->iprogs->hit_name);

		obj->iprogs->hit_name = palloc_string(name);

		SET_BIT(obj->progtypes, IPROG_HIT);
		return;
	}

	RS.Logger.Error("Load_improgs: 'I': invalid program type for vnum {}", obj->vnum);
	exit(1);
}